

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xDisassembler.c
# Opt level: O1

DecodeStatus DecodeMemOperandSc(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = Val >> 10 & 0x1f;
  uVar2 = 0xffffffff;
  if (uVar1 < 0x19) {
    uVar2 = GPRegsDecoderTable[uVar1];
  }
  if (uVar2 == 0xffffffff) {
    return MCDisassembler_Fail;
  }
  uVar1 = Val >> 1 & 0xf;
  if (0xf < uVar1) {
    return MCDisassembler_Fail;
  }
  if ((0xf03U >> uVar1 & 1) == 0) {
    if ((0xf030U >> uVar1 & 1) == 0) {
      return MCDisassembler_Fail;
    }
    uVar3 = 0xffffffff;
    if ((Val & 0x3e0) < 0x301) {
      uVar3 = GPRegsDecoderTable[Val >> 5 & 0x1f];
    }
    if (uVar3 == 0xffffffff) {
      return MCDisassembler_Fail;
    }
    uVar2 = (uVar3 << 5 | uVar2 << 0xc | (Val >> 0xf & 1) << 0x13) + uVar1 * 2 | Val & 1;
  }
  else {
    uVar2 = (Val & 0x3e1) + uVar1 * 2 | uVar2 << 0xc | (Val >> 0xf & 1) << 0x13;
  }
  MCOperand_CreateImm0(Inst,(ulong)uVar2);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeMemOperandSc(MCInst *Inst, unsigned Val,
		uint64_t Address, void *Decoder)
{
	uint8_t scaled, base, offset, mode, unit;
	unsigned basereg, offsetreg;

	scaled = (Val >> 15) & 1;
	base = (Val >> 10) & 0x1f;
	offset = (Val >> 5) & 0x1f;
	mode = (Val >> 1) & 0xf;
	unit = Val & 1;

	if((base >= TMS320C64X_REG_A0) && (base <= TMS320C64X_REG_A31))
		base = (base - TMS320C64X_REG_A0 + TMS320C64X_REG_B0);
	else if((base >= TMS320C64X_REG_B0) && (base <= TMS320C64X_REG_B31))
		base = (base - TMS320C64X_REG_B0 + TMS320C64X_REG_A0);
	basereg = getReg(GPRegsDecoderTable, base);
	if (basereg ==  ~0U)
		return MCDisassembler_Fail;

	switch(mode) {
		case 0:
		case 1:
		case 8:
		case 9:
		case 10:
		case 11:
			MCOperand_CreateImm0(Inst, (scaled << 19) | (basereg << 12) | (offset << 5) | (mode << 1) | unit);
			break;
		case 4:
		case 5:
		case 12:
		case 13:
		case 14:
		case 15:
			if((offset >= TMS320C64X_REG_A0) && (offset <= TMS320C64X_REG_A31))
				offset = (offset - TMS320C64X_REG_A0 + TMS320C64X_REG_B0);
			else if((offset >= TMS320C64X_REG_B0) && (offset <= TMS320C64X_REG_B31))
				offset = (offset - TMS320C64X_REG_B0 + TMS320C64X_REG_A0);
			offsetreg = getReg(GPRegsDecoderTable, offset);
			if (offsetreg ==  ~0U)
				return MCDisassembler_Fail;
			MCOperand_CreateImm0(Inst, (scaled << 19) | (basereg << 12) | (offsetreg << 5) | (mode << 1) | unit);
			break;
		default:
			return MCDisassembler_Fail;
	}

	return MCDisassembler_Success;
}